

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_states.cpp
# Opt level: O3

FState * __thiscall PClassActor::FindState(PClassActor *this,int numnames,FName *names,bool exact)

{
  int iVar1;
  bool bVar2;
  FStateLabels *pFVar3;
  FState *pFVar4;
  FState *pFVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  
  pFVar3 = this->StateList;
  if (pFVar3 == (FStateLabels *)0x0) {
    return (FState *)0x0;
  }
  iVar6 = 0;
  pFVar5 = (FState *)0x0;
  if (numnames < 1) {
    bVar2 = false;
  }
  else {
    while( true ) {
      bVar2 = true;
      if (pFVar3->NumLabels < 1) break;
      iVar7 = pFVar3->NumLabels + -1;
      iVar9 = 0;
      while( true ) {
        uVar8 = (uint)(iVar9 + iVar7) >> 1;
        iVar1 = pFVar3->Labels[uVar8].Label.Index;
        if (iVar1 == names->Index) break;
        if (iVar1 < names->Index) {
          iVar9 = uVar8 + 1;
        }
        else {
          iVar7 = uVar8 - 1;
        }
        if (iVar7 < iVar9) goto LAB_00571b99;
      }
      iVar6 = iVar6 + 1;
      pFVar5 = pFVar3->Labels[uVar8].State;
      pFVar3 = pFVar3->Labels[uVar8].Children;
      bVar2 = iVar6 < numnames;
      if ((pFVar3 == (FStateLabels *)0x0) || (names = names + 1, numnames <= iVar6)) break;
    }
  }
LAB_00571b99:
  pFVar4 = (FState *)0x0;
  if (!exact) {
    pFVar4 = pFVar5;
  }
  if (!bVar2) {
    pFVar4 = pFVar5;
  }
  return pFVar4;
}

Assistant:

FState *PClassActor::FindState(int numnames, FName *names, bool exact) const
{
	FStateLabels *labels = StateList;
	FState *best = NULL;

	if (labels != NULL)
	{
		int count = 0;
		FStateLabel *slabel = NULL;
		FName label;

		// Find the best-matching label for this class.
		while (labels != NULL && count < numnames)
		{
			label = *names++;
			slabel = labels->FindLabel(label);

			if (slabel != NULL)
			{
				count++;
				labels = slabel->Children;
				best = slabel->State;
			}
			else
			{
				break;
			}
		}
		if (count < numnames && exact)
		{
			return NULL;
		}
	}
	return best;
}